

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O1

void ImGuizmo::Manipulate
               (float *view,float *projection,OPERATION operation,MODE mode,float *matrix,
               float *deltaMatrix,float *snap,float *localBounds,float *boundsSnap)

{
  undefined1 auVar1 [16];
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined1 auVar16 [4];
  ImVec2 *pIVar17;
  int i;
  undefined4 uVar18;
  ImGuiIO *pIVar19;
  undefined4 extraout_var;
  ulong uVar20;
  long lVar21;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *buf;
  ulong uVar22;
  float *pfVar23;
  float *pfVar24;
  bool bVar25;
  uint i_4;
  int iVar26;
  long lVar27;
  undefined4 uVar28;
  vec_t *pvVar29;
  ImDrawList *pIVar30;
  float *pfVar31;
  matrix_t *srcMatrix;
  uint i_1;
  float *pfVar32;
  int i_3;
  int iVar33;
  long lVar34;
  int j;
  float *pfVar35;
  undefined8 *puVar36;
  bool bVar37;
  uint uVar38;
  uint uVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  ImVec2 IVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  bool belowAxisLimit;
  bool belowPlaneLimit;
  matrix_t viewInverse;
  matrix_t matT_3;
  ImVec2 midBound;
  matrix_t matT;
  int indices [2];
  matrix_t matT_2;
  matrix_t matT_11;
  matrix_t res_1;
  float local_6e8;
  float fStack_6e4;
  float local_6d8;
  float fStack_6d4;
  bool local_6a9;
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  bool local_679;
  long local_678;
  float local_66c;
  undefined1 local_668 [16];
  float local_654;
  ulong local_650;
  float local_644;
  float local_640;
  float local_63c;
  ulong local_638;
  ImDrawList *local_630;
  undefined1 local_628 [4];
  float afStack_624 [15];
  vec_t local_5e8;
  float afStack_5d8 [4];
  ImVec2 IStack_5c8;
  float local_5c0;
  float local_5bc;
  float fStack_5b8;
  undefined8 uStack_5b4;
  float local_5ac;
  vec_t *local_5a8;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  ImVec2 *local_590;
  ImGuiIO *local_588;
  OPERATION local_57c;
  float local_578;
  float local_574;
  float local_570;
  float local_56c;
  vec_t local_568;
  undefined4 uStack_558;
  undefined4 local_554;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  uint local_538;
  uint local_534;
  uint local_530;
  undefined4 local_52c;
  undefined8 local_528;
  undefined8 local_520;
  undefined1 local_518 [8];
  ImVec2 aIStack_510 [2];
  undefined8 uStack_500;
  ImVec2 local_4f8;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_308 [20];
  undefined4 local_2f4;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  undefined4 local_2cc;
  undefined1 local_2c8 [4];
  float fStack_2c4;
  undefined8 uStack_2c0;
  float local_2b8 [124];
  ImVec2 local_c8 [8];
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  vec_t local_48;
  
  _DAT_001ffffc = *(undefined8 *)view;
  uRam0000000000200004 = *(undefined8 *)(view + 2);
  _DAT_0020000c = *(undefined8 *)(view + 4);
  uRam0000000000200014 = *(undefined8 *)(view + 6);
  _DAT_0020001c = *(undefined8 *)(view + 8);
  uRam0000000000200024 = *(undefined8 *)(view + 10);
  _DAT_0020002c = *(undefined8 *)(view + 0xc);
  uRam0000000000200034 = *(undefined8 *)(view + 0xe);
  _DAT_0020003c = *(undefined8 *)projection;
  uRam0000000000200044 = *(undefined8 *)(projection + 2);
  _DAT_0020004c = *(undefined8 *)(projection + 4);
  uRam0000000000200054 = *(undefined8 *)(projection + 6);
  _DAT_0020005c = *(undefined8 *)(projection + 8);
  uRam0000000000200064 = *(undefined8 *)(projection + 10);
  _DAT_0020006c = *(undefined8 *)(projection + 0xc);
  uRam0000000000200074 = *(undefined8 *)(projection + 0xe);
  DAT_001ffff8 = mode;
  if (mode == LOCAL) {
    _DAT_00200094 = *(undefined8 *)(matrix + 6);
    _DAT_0020009c = *(undefined8 *)(matrix + 8);
    _DAT_002000a4 = *(undefined8 *)(matrix + 10);
    _DAT_002000ac = *(undefined8 *)(matrix + 0xc);
    _DAT_002000b4 = *(undefined8 *)(matrix + 0xe);
    _DAT_0020008c = (float)*(undefined8 *)(matrix + 4);
    _DAT_00200090 = (float)((ulong)*(undefined8 *)(matrix + 4) >> 0x20);
    _DAT_0020007c = (float)*(undefined8 *)matrix;
    _DAT_00200080 = (float)((ulong)*(undefined8 *)matrix >> 0x20);
    _DAT_00200084 = (float)*(undefined8 *)(matrix + 2);
    _DAT_00200088 = (float)((ulong)*(undefined8 *)(matrix + 2) >> 0x20);
    vec_t::Normalize((vec_t *)&DAT_0020007c);
    vec_t::Normalize((vec_t *)&DAT_0020008c);
    vec_t::Normalize((vec_t *)&DAT_0020009c);
  }
  else {
    _DAT_0020007c = 1.0;
    _DAT_00200080 = 0.0;
    _DAT_00200084 = 0.0;
    _DAT_00200088 = 0.0;
    _DAT_0020008c = 0.0;
    _DAT_00200090 = 1.0;
    _DAT_00200094 = 0;
    _DAT_0020009c = 0;
    _DAT_002000a4 = 0x3f800000;
    _DAT_002000ac = *(undefined8 *)(matrix + 0xc);
    _DAT_002000b4 = CONCAT44(0x3f800000,matrix[0xe]);
  }
  DAT_002000fc = matrix[0];
  DAT_00200100 = matrix[1];
  _DAT_00200104 = *(undefined8 *)(matrix + 2);
  _DAT_0020010c = *(undefined8 *)(matrix + 4);
  _DAT_00200114 = *(undefined8 *)(matrix + 6);
  _DAT_0020011c = *(ImVec2 *)(matrix + 8);
  _DAT_00200124 = *(ImVec2 *)(matrix + 10);
  _DAT_0020012c = *(ImVec2 *)(matrix + 0xc);
  _DAT_00200134 = *(ImVec2 *)(matrix + 0xe);
  fVar40 = DAT_00200104 * DAT_00200104 + DAT_002000fc * DAT_002000fc + DAT_00200100 * DAT_00200100;
  if (fVar40 < 0.0) {
    fVar40 = sqrtf(fVar40);
  }
  else {
    fVar40 = SQRT(fVar40);
  }
  fVar41 = DAT_00200114 * DAT_00200114 + DAT_0020010c * DAT_0020010c + DAT_00200110 * DAT_00200110;
  if (fVar41 < 0.0) {
    fVar41 = sqrtf(fVar41);
  }
  else {
    fVar41 = SQRT(fVar41);
  }
  fVar42 = DAT_00200124 * DAT_00200124 + DAT_0020011c * DAT_0020011c + DAT_00200120 * DAT_00200120;
  local_590 = (ImVec2 *)matrix;
  local_57c = operation;
  if (fVar42 < 0.0) {
    DAT_00200204 = sqrtf(fVar42);
  }
  else {
    DAT_00200204 = SQRT(fVar42);
  }
  _DAT_00200208 = 0;
  DAT_002001fc = fVar40;
  DAT_00200200 = fVar41;
  matrix_t::Inverse((matrix_t *)&DAT_002000bc,(matrix_t *)&DAT_0020007c,false);
  matrix_t::Inverse((matrix_t *)&DAT_0020013c,(matrix_t *)&DAT_002000fc,false);
  FPU_MatrixF_x_MatrixF((float *)&DAT_001ffffc,(float *)&DAT_0020003c,(float *)local_518);
  auVar13 = _uStack_500;
  _DAT_002001bc = CONCAT44(local_518._4_4_,local_518._0_4_);
  uRam00000000002001c4 = CONCAT44(aIStack_510[0].y,aIStack_510[0].x);
  _DAT_002001cc = CONCAT44(aIStack_510[1].y,aIStack_510[1].x);
  uRam00000000002001e4 = CONCAT44(uStack_4ec,uStack_4f0);
  _DAT_002001ec = CONCAT44(uStack_4e4,local_4e8);
  uRam00000000002001f4 = CONCAT44(uStack_4dc,uStack_4e0);
  _DAT_002001dc = local_4f8.x;
  DAT_002001dc_4 = local_4f8.y;
  uRam00000000002001d4 = uStack_500;
  _uStack_500 = auVar13;
  FPU_MatrixF_x_MatrixF((float *)&DAT_0020007c,(float *)&DAT_002001bc,(float *)local_518);
  auVar13 = _uStack_500;
  _DAT_0020017c = CONCAT44(local_518._4_4_,local_518._0_4_);
  uRam0000000000200184 = CONCAT44(aIStack_510[0].y,aIStack_510[0].x);
  _DAT_0020018c = CONCAT44(aIStack_510[1].y,aIStack_510[1].x);
  uRam00000000002001a4 = CONCAT44(uStack_4ec,uStack_4f0);
  _DAT_002001ac = CONCAT44(uStack_4e4,local_4e8);
  uRam00000000002001b4 = CONCAT44(uStack_4dc,uStack_4e0);
  _DAT_0020019c = local_4f8.x;
  DAT_0020019c_4 = local_4f8.y;
  uRam0000000000200194 = uStack_500;
  _uStack_500 = auVar13;
  matrix_t::Inverse((matrix_t *)local_628,(matrix_t *)&DAT_001ffffc,false);
  auVar13 = afStack_624._44_16_;
  uRam0000000000200224 = CONCAT44(afStack_624[2],afStack_624[1]);
  _DAT_0020023c = CONCAT44(afStack_624[4],afStack_624[3]);
  uRam0000000000200244 = CONCAT44(afStack_624[6],afStack_624[5]);
  _DAT_0020022c = afStack_624[7];
  DAT_0020022c_4 = afStack_624[8];
  DAT_00200234.x = afStack_624[9];
  DAT_00200234.y = afStack_624[10];
  DAT_0020020c = afStack_624[0xb];
  DAT_00200210 = afStack_624[0xc];
  DAT_00200214 = afStack_624[0xd];
  _DAT_00200218 = afStack_624[0xe];
  _DAT_0020021c = (float)local_628;
  DAT_0020021c_4 = afStack_624[0];
  local_518._0_4_ = (undefined4)_DAT_002000ac;
  local_518._4_4_ = DAT_002000b0;
  aIStack_510[0].x = DAT_002000b4;
  aIStack_510[0].y = 1.0;
  afStack_624._44_16_ = auVar13;
  vec_t::Transform((vec_t *)local_518,(matrix_t *)&DAT_002001bc);
  DAT_00200284 = aIStack_510[0].y * 0.1;
  local_518._0_4_ = 0.0;
  local_518._4_4_ = 0.0;
  aIStack_510[0].x = 0.0;
  aIStack_510[0].y = 0.0;
  _DAT_0020026c = worldToPos((vec_t *)local_518,(matrix_t *)&DAT_0020017c);
  _DAT_00200274 = (float)DAT_0020026c + -10.0;
  DAT_00200278 = DAT_0020026c._4_4_ + -10.0;
  DAT_0020027c = (float)DAT_0020026c + 10.0;
  DAT_00200280 = DAT_0020026c._4_4_ + 10.0;
  pIVar19 = ImGui::GetIO();
  srcMatrix = (matrix_t *)local_2c8;
  FPU_MatrixF_x_MatrixF((float *)&DAT_001ffffc,(float *)&DAT_0020003c,(float *)srcMatrix);
  matrix_t::Inverse((matrix_t *)local_518,srcMatrix,false);
  fVar40 = ((pIVar19->MousePos).x - _DAT_002003b0) / _DAT_002003b8;
  fVar46 = fVar40 + fVar40 + -1.0;
  fVar40 = 1.0 - ((pIVar19->MousePos).y - _DAT_002003b4) / DAT_002003bc;
  fVar42 = fVar40 + fVar40 + -1.0;
  _DAT_00200254 = 0x3f80000000000000;
  DAT_0020024c = fVar46;
  DAT_00200250 = fVar42;
  vec_t::Transform((vec_t *)&DAT_0020024c,(matrix_t *)local_518);
  fVar41 = 1.0 / DAT_00200258;
  fVar44 = DAT_0020024c * fVar41;
  fVar45 = DAT_00200250 * fVar41;
  _DAT_0020024c = CONCAT44(fVar45,fVar44);
  fVar40 = DAT_00200258 * fVar41;
  fVar41 = fVar41 * DAT_00200254;
  _DAT_00200254 = CONCAT44(fVar40,fVar41);
  fVar47 = fVar46 * aIStack_510[0].y + fVar42 * (float)uStack_500._4_4_ + (float)uStack_4ec +
           (float)uStack_4dc;
  fVar48 = 1.0 / fVar47;
  fVar44 = ((float)local_518._0_4_ * fVar46 + aIStack_510[1].x * fVar42 + local_4f8.x +
           (float)local_4e8) * fVar48 - fVar44;
  fVar45 = ((float)local_518._4_4_ * fVar46 + aIStack_510[1].y * fVar42 + local_4f8.y +
           (float)uStack_4e4) * fVar48 - fVar45;
  fVar41 = (aIStack_510[0].x * fVar46 + (float)(undefined4)uStack_500 * fVar42 + (float)uStack_4f0 +
           (float)uStack_4e0) * fVar48 - fVar41;
  fVar40 = fVar48 * fVar47 - fVar40;
  fVar42 = fVar41 * fVar41 + fVar44 * fVar44 + fVar45 * fVar45;
  if (fVar42 < 0.0) {
    local_698._0_4_ = fVar40;
    local_6a8 = ZEXT416((uint)fVar41);
    fVar42 = sqrtf(fVar42);
    fVar40 = (float)local_698._0_4_;
    fVar41 = (float)local_6a8._0_4_;
  }
  else {
    fVar42 = SQRT(fVar42);
  }
  fVar42 = 1.0 / fVar42;
  DAT_0020025c = fVar44 * fVar42;
  DAT_00200260 = fVar45 * fVar42;
  DAT_00200264 = fVar41 * fVar42;
  DAT_00200268 = fVar42 * fVar40;
  if (deltaMatrix != (float *)0x0) {
    *deltaMatrix = 1.0;
    deltaMatrix[1] = 0.0;
    deltaMatrix[2] = 0.0;
    deltaMatrix[3] = 0.0;
    deltaMatrix[4] = 0.0;
    deltaMatrix[5] = 1.0;
    deltaMatrix[6] = 0.0;
    deltaMatrix[7] = 0.0;
    deltaMatrix[8] = 0.0;
    deltaMatrix[9] = 0.0;
    deltaMatrix[10] = 1.0;
    deltaMatrix[0xb] = 0.0;
    deltaMatrix[0xc] = 0.0;
    deltaMatrix[0xd] = 0.0;
    deltaMatrix[0xe] = 0.0;
    deltaMatrix[0xf] = 1.0;
  }
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  local_48.w = 0.0;
  vec_t::TransformPoint(&local_48,(matrix_t *)&DAT_0020017c);
  if (local_48.z < 0.001) {
    return;
  }
  uVar22 = 0;
  if ((DAT_00200299 != 1) || (DAT_00200368 != '\0')) goto LAB_00130b78;
  if (local_57c == TRANSLATE) {
    pIVar19 = ImGui::GetIO();
    if (DAT_00200298 != '\x01') {
      uVar38 = GetMoveType((vec_t *)local_2c8);
      uVar22 = CONCAT44(extraout_var_01,uVar38);
      if ((uVar38 != 0) && (pIVar19->MouseDown[0] != false)) {
        DAT_00200298 = '\x01';
        local_518._0_4_ = _DAT_0020008c;
        local_518._4_4_ = _DAT_00200090;
        aIStack_510[0].x = (float)_DAT_00200094;
        aIStack_510[0].y = (float)((ulong)_DAT_00200094 >> 0x20);
        aIStack_510[1].x = (float)_DAT_0020009c;
        aIStack_510[1].y = (float)((ulong)_DAT_0020009c >> 0x20);
        local_4f8 = (ImVec2)CONCAT44(_DAT_00200080,_DAT_0020007c);
        uStack_500 = _DAT_002000a4;
        uStack_4f0 = _DAT_00200084;
        uStack_4ec = _DAT_00200088;
        uStack_4e0 = (undefined4)_DAT_002000a4;
        uStack_4dc = (undefined4)((ulong)_DAT_002000a4 >> 0x20);
        local_4d8 = CONCAT44(_DAT_00200080,_DAT_0020007c);
        uStack_4d0 = CONCAT44(_DAT_00200088,_DAT_00200084);
        local_4c8 = CONCAT44(_DAT_00200090,_DAT_0020008c);
        uStack_4c0 = _DAT_00200094;
        local_4b8 = -_DAT_0020022c;
        fStack_4b4 = -DAT_0020022c_4;
        fStack_4b0 = -DAT_00200234.x;
        fStack_4ac = -DAT_00200234.y;
        lVar34 = (long)(int)uVar38 * 0x10;
        fVar40 = *(float *)(lVar34 + -0x10 + (long)local_518);
        fVar41 = *(float *)(lVar34 + -0xc + (long)local_518);
        fVar42 = *(float *)(lVar34 + -8 + (long)local_518);
        fVar44 = *(float *)(lVar34 + -4 + (long)local_518);
        fVar45 = fVar42 * fVar42 + fVar40 * fVar40 + fVar41 * fVar41;
        DAT_002003ac = uVar38;
        local_4e8 = aIStack_510[1].x;
        uStack_4e4 = aIStack_510[1].y;
        if (fVar45 < 0.0) {
          local_6a8 = ZEXT416((uint)fVar44);
          fVar45 = sqrtf(fVar45);
          fVar44 = (float)local_6a8._0_4_;
        }
        else {
          fVar45 = SQRT(fVar45);
        }
        fVar45 = 1.0 / fVar45;
        fVar40 = fVar40 * fVar45;
        fVar41 = fVar41 * fVar45;
        fVar42 = fVar42 * fVar45;
        fVar44 = fVar44 * fVar45 * DAT_002000b8 +
                 fVar42 * DAT_002000b4 + fVar40 * DAT_002000ac + fVar41 * DAT_002000b0;
        _DAT_0020029c = CONCAT44(fVar41,fVar40);
        _DAT_002002a4 = CONCAT44(fVar44,fVar42);
        fVar45 = fVar42 * DAT_00200264 + fVar40 * DAT_0020025c + fVar41 * DAT_00200260;
        uVar38 = -(uint)(ABS(fVar45) < 1.1920929e-07);
        fVar44 = (float)(uVar38 & 0xbf800000 |
                        ~uVar38 & (uint)(-((fVar42 * DAT_00200254 +
                                           fVar40 * DAT_0020024c + fVar41 * DAT_00200250) - fVar44)
                                        / fVar45));
        fVar40 = DAT_0020025c * fVar44 + DAT_0020024c;
        fVar41 = DAT_00200260 * fVar44 + DAT_00200250;
        fVar42 = DAT_00200268 * fVar44 + DAT_00200258;
        fVar44 = fVar44 * DAT_00200264 + DAT_00200254;
        _DAT_002002b4 = CONCAT44(fVar42,fVar44);
        _DAT_002002ac = CONCAT44(fVar41,fVar40);
        _DAT_002002bc = _DAT_002000ac;
        _DAT_002002c4 = _DAT_002000b4;
        _DAT_00200294 = 1.0 / DAT_00200284;
        DAT_00200288 = (fVar40 - DAT_002000ac) * _DAT_00200294;
        DAT_0020028c = (fVar41 - DAT_002000b0) * _DAT_00200294;
        DAT_00200290 = (fVar44 - DAT_002000b4) * _DAT_00200294;
        _DAT_00200294 = _DAT_00200294 * (fVar42 - DAT_002000b8);
      }
      goto LAB_00130b78;
    }
    fVar40 = DAT_002002a4 * DAT_00200264 + DAT_0020029c * DAT_0020025c + DAT_002002a0 * DAT_00200260
    ;
    uVar38 = -(uint)(ABS(fVar40) < 1.1920929e-07);
    fVar40 = (float)(uVar38 & 0xbf800000 |
                    ~uVar38 & (uint)(-((DAT_002002a4 * DAT_00200254 +
                                       DAT_0020029c * DAT_0020024c + DAT_002002a0 * DAT_00200250) -
                                      _DAT_002002a8) / fVar40));
    local_4e8 = ((DAT_0020025c * fVar40 + DAT_0020024c) - DAT_00200288 * DAT_00200284) -
                DAT_002000ac;
    uStack_4e4 = ((DAT_00200260 * fVar40 + DAT_00200250) - DAT_0020028c * DAT_00200284) -
                 DAT_002000b0;
    uStack_4e0 = ((DAT_00200264 * fVar40 + DAT_00200254) - DAT_00200290 * DAT_00200284) -
                 DAT_002000b4;
    if (DAT_002003ac - 1 < 3) {
      lVar34 = (ulong)(DAT_002003ac - 1) * 0x10;
      fVar40 = (float)uStack_4e0 * *(float *)(&DAT_00200084 + lVar34) +
               (float)local_4e8 * *(float *)(&DAT_0020007c + lVar34) +
               (float)uStack_4e4 * *(float *)(&DAT_00200080 + lVar34);
      local_4e8 = *(float *)(&DAT_0020007c + lVar34) * fVar40;
      uStack_4e4 = *(float *)(&DAT_00200080 + lVar34) * fVar40;
      uStack_4e0 = *(float *)(&DAT_00200084 + lVar34) * fVar40;
      fVar40 = fVar40 * *(float *)(&DAT_00200088 + lVar34);
    }
    else {
      fVar40 = ((fVar40 * DAT_00200268 + DAT_00200258) - DAT_00200284 * _DAT_00200294) -
               DAT_002000b8;
    }
    if (snap != (float *)0x0) {
      local_628 = (undefined1  [4])((DAT_002000ac + (float)local_4e8) - DAT_002002bc);
      afStack_624[1] = (DAT_002000b4 + (float)uStack_4e0) - DAT_002002c4;
      afStack_624[2] = (DAT_002000b8 + fVar40) - DAT_002002c8;
      afStack_624[0] = (DAT_002000b0 + (float)uStack_4e4) - DAT_002002c0;
      if (DAT_001ffff8 == LOCAL) {
        local_518._0_4_ = DAT_002000fc;
        local_518._4_4_ = DAT_002000fc._4_4_;
        uVar28 = local_518._4_4_;
        aIStack_510[0].x = (float)_DAT_00200104;
        fVar40 = aIStack_510[0].x;
        aIStack_510[0].y = (float)((ulong)_DAT_00200104 >> 0x20);
        local_4e8 = (undefined4)DAT_0020012c;
        uStack_4e4 = DAT_0020012c._4_4_;
        uStack_4e0 = (undefined4)DAT_00200134;
        uStack_4dc = DAT_00200134._4_4_;
        uStack_4f0 = DAT_00200124;
        uStack_4ec = DAT_00200124._4_4_;
        aIStack_510[1].x = (float)_DAT_0020010c;
        aIStack_510[1].y = (float)((ulong)_DAT_0020010c >> 0x20);
        local_4f8 = _DAT_0020011c;
        uStack_500 = _DAT_00200114;
        fVar41 = aIStack_510[0].x * aIStack_510[0].x +
                 (float)local_518._0_4_ * (float)local_518._0_4_ +
                 (float)local_518._4_4_ * (float)local_518._4_4_;
        if (fVar41 < 0.0) {
          local_6a8._0_4_ = local_518._0_4_;
          fVar41 = sqrtf(fVar41);
          local_518._0_4_ = local_6a8._0_4_;
        }
        else {
          fVar41 = SQRT(fVar41);
        }
        fVar41 = 1.0 / fVar41;
        local_518._0_4_ = (float)local_518._0_4_ * fVar41;
        fVar42 = (float)uVar28 * fVar41;
        fVar40 = fVar40 * fVar41;
        aIStack_510[0].y = fVar41 * aIStack_510[0].y;
        fVar41 = (float)(undefined4)uStack_500 * (float)(undefined4)uStack_500 +
                 aIStack_510[1].x * aIStack_510[1].x + aIStack_510[1].y * aIStack_510[1].y;
        local_6a8._0_4_ = local_518._0_4_;
        local_638 = CONCAT44(local_638._4_4_,aIStack_510[0].y);
        local_518._4_4_ = fVar42;
        aIStack_510[0].x = fVar40;
        if (fVar41 < 0.0) {
          local_698._0_4_ = (undefined4)uStack_500;
          local_668._0_4_ = aIStack_510[1].y;
          local_678 = CONCAT44(local_678._4_4_,aIStack_510[1].x);
          fVar41 = sqrtf(fVar41);
          aIStack_510[1].y = (float)local_668._0_4_;
          uVar28 = local_698._0_4_;
          aIStack_510[1].x = (float)local_678;
        }
        else {
          fVar41 = SQRT(fVar41);
          uVar28 = (undefined4)uStack_500;
        }
        auVar13 = _uStack_500;
        fVar41 = 1.0 / fVar41;
        aIStack_510[1].x = aIStack_510[1].x * fVar41;
        local_678 = CONCAT44(local_678._4_4_,aIStack_510[1].x);
        aIStack_510[1].y = aIStack_510[1].y * fVar41;
        local_668._0_4_ = aIStack_510[1].y;
        local_698._0_4_ = (float)uVar28 * fVar41;
        local_66c = fVar41 * (float)uStack_500._4_4_;
        uStack_500._4_4_ = local_66c;
        uStack_500._0_4_ = (float)uVar28 * fVar41;
        auVar1 = _uStack_500;
        local_4f8.x = auVar13._8_4_;
        local_4f8.y = auVar13._12_4_;
        fVar41 = (float)uStack_4f0 * (float)uStack_4f0 +
                 local_4f8.x * local_4f8.x + local_4f8.y * local_4f8.y;
        if (fVar41 < 0.0) {
          local_5a8 = (vec_t *)CONCAT44(local_5a8._4_4_,local_4f8.x);
          local_630 = (ImDrawList *)CONCAT44(local_630._4_4_,local_4f8.y);
          local_588 = (ImGuiIO *)CONCAT44(local_588._4_4_,uStack_4f0);
          _uStack_500 = auVar1;
          fVar41 = sqrtf(fVar41);
          local_4f8.y = local_630._0_4_;
          local_4f8.x = local_5a8._0_4_;
          uStack_4f0 = local_588._0_4_;
        }
        else {
          fVar41 = SQRT(fVar41);
        }
        fVar41 = 1.0 / fVar41;
        local_5a8 = (vec_t *)CONCAT44(local_5a8._4_4_,local_4f8.x * fVar41);
        local_4f8.x = local_4f8.x * fVar41;
        local_630 = (ImDrawList *)CONCAT44(local_630._4_4_,local_4f8.y * fVar41);
        local_4f8.y = local_4f8.y * fVar41;
        uStack_4f0 = (float)uStack_4f0 * fVar41;
        local_588 = (ImGuiIO *)CONCAT44(local_588._4_4_,uStack_4f0);
        local_63c = fVar41 * (float)uStack_4ec;
        lVar34 = 0;
        uStack_4ec = local_63c;
        matrix_t::Inverse((matrix_t *)local_2c8,(matrix_t *)local_518,false);
        fVar41 = local_2b8[4] * afStack_624[1];
        fVar45 = fStack_2c4 * (float)local_628;
        fVar44 = local_2b8[5] * afStack_624[1];
        afStack_624[2] =
             afStack_624[1] * local_2b8[7] +
             (float)local_628 * (float)uStack_2c0._4_4_ + afStack_624[0] * local_2b8[3];
        afStack_624[1] =
             local_2b8[6] * afStack_624[1] +
             (float)(undefined4)uStack_2c0 * (float)local_628 + local_2b8[2] * afStack_624[0];
        local_628 = (undefined1  [4])
                    (fVar41 + (float)local_2c8 * (float)local_628 + local_2b8[0] * afStack_624[0]);
        afStack_624[0] = fVar44 + fVar45 + local_2b8[1] * afStack_624[0];
        do {
          ComputeSnap((float *)(local_628 + lVar34),*(float *)((long)snap + lVar34));
          lVar34 = lVar34 + 4;
        } while (lVar34 != 0xc);
        fVar41 = (float)local_678 * afStack_624[0];
        fVar44 = (float)local_698._0_4_ * afStack_624[0];
        fVar40 = fVar40 * (float)local_628;
        afStack_624[2] =
             local_63c * afStack_624[1] +
             (float)local_638 * (float)local_628 + local_66c * afStack_624[0];
        afStack_624[0] =
             local_630._0_4_ * afStack_624[1] +
             fVar42 * (float)local_628 + (float)local_668._0_4_ * afStack_624[0];
        local_628 = (undefined1  [4])
                    (local_5a8._0_4_ * afStack_624[1] +
                    (float)local_6a8._0_4_ * (float)local_628 + fVar41);
        afStack_624[1] = local_588._0_4_ * afStack_624[1] + fVar40 + fVar44;
      }
      else {
        lVar34 = 0;
        do {
          ComputeSnap((float *)(local_628 + lVar34),*(float *)((long)snap + lVar34));
          lVar34 = lVar34 + 4;
        } while (lVar34 != 0xc);
      }
      local_4e8 = (DAT_002002bc + (float)local_628) - DAT_002000ac;
      uStack_4e4 = (DAT_002002c0 + afStack_624[0]) - DAT_002000b0;
      uStack_4e0 = (DAT_002002c4 + afStack_624[1]) - DAT_002000b4;
    }
    pIVar17 = local_590;
    local_518._0_4_ = 1.0;
    local_518._4_4_ = 0.0;
    aIStack_510[0].x = 0.0;
    aIStack_510[0].y = 0.0;
    aIStack_510[1].x = 0.0;
    aIStack_510[1].y = 1.0;
    _uStack_500 = ZEXT816(0);
    uStack_4f0 = 1.0;
    uStack_4ec = 0.0;
    uStack_4dc = 1.0;
    if (deltaMatrix != (float *)0x0) {
      *(ulong *)(deltaMatrix + 0xc) = CONCAT44(uStack_4e4,local_4e8);
      deltaMatrix[0xe] = (float)uStack_4e0;
      deltaMatrix[0xf] = 1.0;
      deltaMatrix[8] = 0.0;
      deltaMatrix[9] = 0.0;
      deltaMatrix[10] = 1.0;
      deltaMatrix[0xb] = 0.0;
      deltaMatrix[4] = 0.0;
      deltaMatrix[5] = 1.0;
      deltaMatrix[6] = 0.0;
      deltaMatrix[7] = 0.0;
      *deltaMatrix = 1.0;
      deltaMatrix[1] = 0.0;
      deltaMatrix[2] = 0.0;
      deltaMatrix[3] = 0.0;
    }
    FPU_MatrixF_x_MatrixF(&DAT_002000fc,(float *)local_518,(float *)local_2c8);
    IVar43.y = fStack_2c4;
    IVar43.x = (float)local_2c8;
    IVar8.y = (float)uStack_2c0._4_4_;
    IVar8.x = (float)(undefined4)uStack_2c0;
    IVar10.y = local_2b8[5];
    IVar10.x = local_2b8[4];
    IVar12.y = local_2b8[7];
    IVar12.x = local_2b8[6];
    pIVar17[6].x = local_2b8[8];
    pIVar17[6].y = local_2b8[9];
    pIVar17[7].x = local_2b8[10];
    pIVar17[7].y = local_2b8[0xb];
    pIVar17[4] = IVar10;
    pIVar17[5] = IVar12;
    pIVar17[2].x = local_2b8[0];
    pIVar17[2].y = local_2b8[1];
    pIVar17[3].x = local_2b8[2];
    pIVar17[3].y = local_2b8[3];
    *pIVar17 = IVar43;
    pIVar17[1] = IVar8;
  }
  else {
    if (local_57c != SCALE) {
      if (local_57c == ROTATE) {
        pIVar19 = ImGui::GetIO();
        bVar37 = DAT_001ffff8 == LOCAL;
        uVar22 = 0;
        bVar25 = bVar37;
        if (DAT_00200298 == '\0') {
          uVar38 = GetRotateType();
          uVar22 = CONCAT44(extraout_var,uVar38);
          bVar25 = uVar38 == 0xb || bVar37;
          if ((uVar38 != 0) && (pIVar19->MouseDown[0] != false)) {
            DAT_00200298 = '\x01';
            local_518._0_4_ = _DAT_0020007c;
            local_518._4_4_ = _DAT_00200080;
            aIStack_510[0].x = _DAT_00200084;
            aIStack_510[0].y = _DAT_00200088;
            aIStack_510[1].x = _DAT_0020008c;
            aIStack_510[1].y = _DAT_00200090;
            local_4f8 = (ImVec2)_DAT_0020009c;
            uStack_500 = _DAT_00200094;
            uStack_4f0 = (undefined4)_DAT_002000a4;
            uStack_4ec = (undefined4)((ulong)_DAT_002000a4 >> 0x20);
            local_4e8 = -_DAT_0020022c;
            uStack_4e4 = -DAT_0020022c_4;
            uStack_4e0 = -DAT_00200234.x;
            uStack_4dc = -DAT_00200234.y;
            if (uVar38 == 0xb || bVar37) {
              pfVar23 = (float *)(local_518 + (long)(int)(uVar38 - 8) * 0x10);
              pfVar32 = &DAT_002000b8;
              pfVar24 = &DAT_002000b4;
              pfVar31 = &DAT_002000b0;
              pfVar35 = &DAT_002000ac;
            }
            else {
              pfVar23 = (float *)(&directionUnary + (long)(int)(uVar38 - 8) * 4);
              pfVar32 = (float *)&DAT_00200138;
              pfVar24 = (float *)&DAT_00200134;
              pfVar31 = (float *)&DAT_00200130;
              pfVar35 = (float *)&DAT_0020012c;
            }
            fVar40 = *pfVar23;
            fVar41 = pfVar23[1];
            fVar42 = pfVar23[2];
            fVar44 = fVar42 * fVar42 + fVar40 * fVar40 + fVar41 * fVar41;
            DAT_002003ac = uVar38;
            local_650 = uVar22;
            if (fVar44 < 0.0) {
              local_6a8 = ZEXT416((uint)fVar42);
              local_698 = ZEXT416((uint)fVar41);
              local_668 = ZEXT416((uint)pfVar23[3]);
              fVar44 = sqrtf(fVar44);
              fVar41 = (float)local_698._0_4_;
              fVar45 = (float)local_668._0_4_;
              fVar42 = (float)local_6a8._0_4_;
            }
            else {
              fVar44 = SQRT(fVar44);
              fVar45 = pfVar23[3];
            }
            fVar44 = 1.0 / fVar44;
            fVar40 = fVar40 * fVar44;
            fVar41 = fVar41 * fVar44;
            fVar42 = fVar42 * fVar44;
            fVar44 = fVar45 * fVar44 * *pfVar32 +
                     *pfVar24 * fVar42 + *pfVar35 * fVar40 + *pfVar31 * fVar41;
            _DAT_0020029c = CONCAT44(fVar41,fVar40);
            _DAT_002002a4 = CONCAT44(fVar44,fVar42);
            fVar45 = fVar42 * DAT_00200264 + fVar40 * DAT_0020025c + fVar41 * DAT_00200260;
            uVar38 = -(uint)(ABS(fVar45) < 1.1920929e-07);
            fVar40 = (float)(uVar38 & 0xbf800000 |
                            ~uVar38 & (uint)(-((fVar42 * DAT_00200254 +
                                               fVar40 * DAT_0020024c + fVar41 * DAT_00200250) -
                                              fVar44) / fVar45));
            fVar45 = (DAT_0020025c * fVar40 + DAT_0020024c) - DAT_002000ac;
            fVar41 = (DAT_00200260 * fVar40 + DAT_00200250) - DAT_002000b0;
            fVar42 = (fVar40 * DAT_00200264 + DAT_00200254) - DAT_002000b4;
            fVar40 = (DAT_00200268 * fVar40 + DAT_00200258) - DAT_002000b8;
            fVar44 = fVar42 * fVar42 + fVar45 * fVar45 + fVar41 * fVar41;
            if (fVar44 < 0.0) {
              local_6a8 = ZEXT416((uint)fVar41);
              local_698 = ZEXT416((uint)fVar40);
              local_668._4_4_ = 0x80000000;
              local_668._0_4_ = fVar42;
              local_668._8_4_ = 0x80000000;
              local_668._12_4_ = 0x80000000;
              fVar44 = sqrtf(fVar44);
              fVar40 = (float)local_698._0_4_;
              fVar41 = (float)local_6a8._0_4_;
              fVar42 = (float)local_668._0_4_;
            }
            else {
              fVar44 = SQRT(fVar44);
            }
            fVar44 = 1.0 / fVar44;
            DAT_002002cc = fVar45 * fVar44;
            DAT_002002d0 = fVar41 * fVar44;
            DAT_002002d4 = fVar42 * fVar44;
            fRam00000000002002d8 = fVar40 * fVar44;
            _DAT_002002e0 = ComputeAngleOnPlan();
            uVar22 = local_650;
          }
        }
        if (DAT_00200298 == '\x01') {
          DAT_002002dc = ComputeAngleOnPlan();
          if (snap != (float *)0x0) {
            ComputeSnap(&DAT_002002dc,*snap * 0.017453292);
          }
          local_568.x = (float)_DAT_0020029c;
          local_568.y = (float)((ulong)_DAT_0020029c >> 0x20);
          local_568.z = DAT_002002a4;
          local_568.w = 0.0;
          vec_t::TransformVector(&local_568,(matrix_t *)&DAT_002000bc);
          fVar40 = local_568.y;
          fVar41 = local_568.z * local_568.z + local_568.x * local_568.x + local_568.y * local_568.y
          ;
          if (fVar41 < 0.0) {
            local_6a8._0_4_ = local_568.x;
            local_698._0_4_ = local_568.z;
            fVar41 = sqrtf(fVar41);
            local_568.z = (float)local_698._0_4_;
            local_568.x = (float)local_6a8._0_4_;
          }
          else {
            fVar41 = SQRT(fVar41);
          }
          fVar41 = 1.0 / fVar41;
          local_568.x = local_568.x * fVar41;
          local_568.y = fVar40 * fVar41;
          local_568.z = local_568.z * fVar41;
          local_568.w = fVar41 * local_568.w;
          matrix_t::RotationAxis((matrix_t *)local_518,&local_568,DAT_002002dc - _DAT_002002e0);
          _DAT_002002e0 = DAT_002002dc;
          local_2c8 = (undefined1  [4])DAT_002001fc;
          fStack_2c4 = 0.0;
          uStack_2c0._0_4_ = 0.0;
          uStack_2c0._4_4_ = 0.0;
          local_2b8[0] = 0.0;
          local_2b8[1] = DAT_00200200;
          local_2b8[2] = 0.0;
          local_2b8[3] = 0.0;
          local_2b8[4] = 0.0;
          local_2b8[5] = 0.0;
          local_2b8[6] = DAT_00200204;
          local_2b8[7] = 0.0;
          local_2b8[8] = 0.0;
          local_2b8[9] = 0.0;
          local_2b8[10] = 0.0;
          local_2b8[0xb] = 1.0;
          if (bVar25) {
            FPU_MatrixF_x_MatrixF((float *)local_2c8,(float *)local_518,&local_5e8.x);
            FPU_MatrixF_x_MatrixF(&local_5e8.x,(float *)&DAT_0020007c,(float *)local_628);
            IVar2.y = afStack_624[2];
            IVar2.x = afStack_624[1];
            local_590[6].x = afStack_624[0xb];
            local_590[6].y = afStack_624[0xc];
            local_590[7].x = afStack_624[0xd];
            local_590[7].y = afStack_624[0xe];
            local_590[4].x = afStack_624[7];
            local_590[4].y = afStack_624[8];
            local_590[5].x = afStack_624[9];
            local_590[5].y = afStack_624[10];
            local_590[2].x = afStack_624[3];
            local_590[2].y = afStack_624[4];
            local_590[3].x = afStack_624[5];
            local_590[3].y = afStack_624[6];
            local_590->x = (float)local_628;
            local_590->y = afStack_624[0];
            local_590[1] = IVar2;
          }
          else {
            afStack_624[7] = DAT_0020011c;
            afStack_624[8] = DAT_00200120;
            afStack_624[9] = DAT_00200124;
            afStack_624[10] = DAT_00200124_4;
            afStack_624[3] = (float)_DAT_0020010c;
            afStack_624[4] = (float)((ulong)_DAT_0020010c >> 0x20);
            afStack_624[5] = (float)_DAT_00200114;
            afStack_624[6] = (float)((ulong)_DAT_00200114 >> 0x20);
            local_628 = (undefined1  [4])DAT_002000fc;
            afStack_624[0] = DAT_00200100;
            afStack_624[1] = (float)_DAT_00200104;
            afStack_624[2] = (float)((ulong)_DAT_00200104 >> 0x20);
            afStack_624._44_16_ = ZEXT416(0);
            FPU_MatrixF_x_MatrixF((float *)local_628,(float *)local_518,&local_5e8.x);
            IVar3.y = local_5e8.y;
            IVar3.x = local_5e8.x;
            IVar4.y = local_5e8.w;
            IVar4.x = local_5e8.z;
            IVar5.y = local_5bc;
            IVar5.x = local_5c0;
            local_590[6].x = fStack_5b8;
            local_590[6].y = (float)uStack_5b4;
            local_590[7].x = uStack_5b4._4_4_;
            local_590[7].y = local_5ac;
            local_590[4] = IStack_5c8;
            local_590[5] = IVar5;
            local_590[2].x = afStack_5d8[0];
            local_590[2].y = afStack_5d8[1];
            local_590[3].x = afStack_5d8[2];
            local_590[3].y = afStack_5d8[3];
            *local_590 = IVar3;
            local_590[1] = IVar4;
            IVar43 = _DAT_00200134;
            local_590[6] = _DAT_0020012c;
            local_590[7] = IVar43;
          }
          if (deltaMatrix != (float *)0x0) {
            FPU_MatrixF_x_MatrixF((float *)&DAT_002000bc,(float *)local_518,&local_5e8.x);
            FPU_MatrixF_x_MatrixF(&local_5e8.x,(float *)&DAT_0020007c,(float *)local_628);
            deltaMatrix[0xc] = afStack_624[0xb];
            deltaMatrix[0xd] = afStack_624[0xc];
            deltaMatrix[0xe] = afStack_624[0xd];
            deltaMatrix[0xf] = afStack_624[0xe];
            ((ImVec2 *)(deltaMatrix + 8))->x = afStack_624[7];
            ((ImVec2 *)(deltaMatrix + 8))->y = afStack_624[8];
            ((ImVec2 *)(deltaMatrix + 10))->x = afStack_624[9];
            ((ImVec2 *)(deltaMatrix + 10))->y = afStack_624[10];
            deltaMatrix[4] = afStack_624[3];
            deltaMatrix[5] = afStack_624[4];
            deltaMatrix[6] = afStack_624[5];
            deltaMatrix[7] = afStack_624[6];
            *(undefined8 *)deltaMatrix = _local_628;
            *(ulong *)(deltaMatrix + 2) = CONCAT44(afStack_624[2],afStack_624[1]);
          }
          if (pIVar19->MouseDown[0] == false) {
            DAT_00200298 = '\0';
          }
          uVar22 = (ulong)DAT_002003ac;
        }
      }
      goto LAB_00130b78;
    }
    pIVar19 = ImGui::GetIO();
    uVar22 = 0;
    if (DAT_00200298 == '\0') {
      uVar38 = GetScaleType();
      uVar22 = CONCAT44(extraout_var_00,uVar38);
      if ((uVar38 != 0) && (pIVar19->MouseDown[0] != false)) {
        DAT_00200298 = '\x01';
        local_518._0_4_ = _DAT_0020008c;
        local_518._4_4_ = _DAT_00200090;
        aIStack_510[0].x = (float)_DAT_00200094;
        aIStack_510[0].y = (float)((ulong)_DAT_00200094 >> 0x20);
        aIStack_510[1].x = (float)_DAT_0020009c;
        aIStack_510[1].y = (float)((ulong)_DAT_0020009c >> 0x20);
        local_4f8 = (ImVec2)CONCAT44(_DAT_00200080,_DAT_0020007c);
        uStack_500 = _DAT_002000a4;
        uStack_4f0 = _DAT_00200084;
        uStack_4ec = _DAT_00200088;
        uStack_4e0 = (undefined4)_DAT_002000a4;
        uStack_4dc = (undefined4)((ulong)_DAT_002000a4 >> 0x20);
        local_4d8 = CONCAT44(_DAT_00200090,_DAT_0020008c);
        uStack_4d0 = _DAT_00200094;
        local_4c8 = CONCAT44(_DAT_00200080,_DAT_0020007c);
        uStack_4c0 = CONCAT44(_DAT_00200088,_DAT_00200084);
        local_4b8 = -_DAT_0020022c;
        fStack_4b4 = -DAT_0020022c_4;
        fStack_4b0 = -DAT_00200234.x;
        fStack_4ac = -DAT_00200234.y;
        lVar34 = (long)(int)uVar38 * 0x10;
        fVar40 = ((matrix_t *)local_518)[-3].field_0.m[(int)uVar38][0];
        fVar41 = *(float *)(lVar34 + -0xbc + (long)local_518);
        fVar42 = *(float *)(lVar34 + -0xb8 + (long)local_518);
        fVar44 = *(float *)(lVar34 + -0xb4 + (long)local_518);
        fVar45 = fVar42 * fVar42 + fVar40 * fVar40 + fVar41 * fVar41;
        DAT_002003ac = uVar38;
        local_4e8 = aIStack_510[1].x;
        uStack_4e4 = aIStack_510[1].y;
        if (fVar45 < 0.0) {
          local_6a8 = ZEXT416((uint)fVar41);
          local_698 = ZEXT416((uint)fVar44);
          fVar45 = sqrtf(fVar45);
          fVar41 = (float)local_6a8._0_4_;
          fVar44 = (float)local_698._0_4_;
        }
        else {
          fVar45 = SQRT(fVar45);
        }
        fVar45 = 1.0 / fVar45;
        fVar40 = fVar40 * fVar45;
        fVar41 = fVar41 * fVar45;
        fVar42 = fVar42 * fVar45;
        fVar44 = fVar44 * fVar45 * DAT_002000b8 +
                 fVar42 * DAT_002000b4 + fVar40 * DAT_002000ac + fVar41 * DAT_002000b0;
        _DAT_0020029c = CONCAT44(fVar41,fVar40);
        _DAT_002002a4 = CONCAT44(fVar44,fVar42);
        fVar45 = fVar42 * DAT_00200264 + fVar40 * DAT_0020025c + fVar41 * DAT_00200260;
        uVar38 = -(uint)(ABS(fVar45) < 1.1920929e-07);
        fVar44 = (float)(uVar38 & 0xbf800000 |
                        ~uVar38 & (uint)(-((fVar42 * DAT_00200254 +
                                           fVar40 * DAT_0020024c + fVar41 * DAT_00200250) - fVar44)
                                        / fVar45));
        fVar40 = DAT_0020025c * fVar44 + DAT_0020024c;
        fVar41 = DAT_00200260 * fVar44 + DAT_00200250;
        fVar42 = DAT_00200268 * fVar44 + DAT_00200258;
        fVar44 = fVar44 * DAT_00200264 + DAT_00200254;
        _DAT_002002b4 = CONCAT44(fVar42,fVar44);
        _DAT_002002ac = CONCAT44(fVar41,fVar40);
        _DAT_002002bc = _DAT_002000ac;
        _DAT_002002c4 = _DAT_002000b4;
        _DAT_002002e4 = 0x3f8000003f800000;
        _DAT_002002ec = 0x3f800000;
        _DAT_00200294 = 1.0 / DAT_00200284;
        DAT_00200288 = (fVar40 - DAT_002000ac) * _DAT_00200294;
        DAT_0020028c = (fVar41 - DAT_002000b0) * _DAT_00200294;
        DAT_00200290 = (fVar44 - DAT_002000b4) * _DAT_00200294;
        _DAT_00200294 = _DAT_00200294 * (fVar42 - DAT_002000b8);
        fVar40 = DAT_00200104 * DAT_00200104 +
                 DAT_002000fc * DAT_002000fc + DAT_00200100 * DAT_00200100;
        if (fVar40 < 0.0) {
          fVar40 = sqrtf(fVar40);
        }
        else {
          fVar40 = SQRT(fVar40);
        }
        fVar41 = DAT_00200114 * DAT_00200114 +
                 DAT_0020010c * DAT_0020010c + DAT_00200110 * DAT_00200110;
        if (fVar41 < 0.0) {
          fVar41 = sqrtf(fVar41);
        }
        else {
          fVar41 = SQRT(fVar41);
        }
        fVar42 = DAT_00200124 * DAT_00200124 +
                 DAT_0020011c * DAT_0020011c + DAT_00200120 * DAT_00200120;
        if (fVar42 < 0.0) {
          fVar42 = sqrtf(fVar42);
        }
        else {
          fVar42 = SQRT(fVar42);
        }
        _DAT_002002f8 = fVar41;
        _DAT_002002f4 = fVar40;
        _DAT_002002fc = fVar42;
        unique0x100008f1 = 0;
        _DAT_00200304 = (pIVar19->MousePos).x;
      }
    }
    if (DAT_00200298 != '\x01') goto LAB_00130b78;
    uVar38 = DAT_002003ac - 0xc;
    if (uVar38 < 3) {
      fVar40 = DAT_002002a4 * DAT_00200264 +
               DAT_0020029c * DAT_0020025c + DAT_002002a0 * DAT_00200260;
      uVar39 = -(uint)(ABS(fVar40) < 1.1920929e-07);
      fVar44 = (float)(uVar39 & 0xbf800000 |
                      ~uVar39 & (uint)(-((DAT_002002a4 * DAT_00200254 +
                                         DAT_0020029c * DAT_0020024c + DAT_002002a0 * DAT_00200250)
                                        - _DAT_002002a8) / fVar40));
      lVar34 = (ulong)uVar38 * 0x10;
      fVar40 = *(float *)(&DAT_0020007c + lVar34);
      fVar41 = *(float *)(&DAT_00200080 + lVar34);
      fVar42 = *(float *)(&DAT_00200084 + lVar34);
      fVar44 = (((DAT_00200264 * fVar44 + DAT_00200254) - DAT_00200290 * DAT_00200284) -
               DAT_002000b4) * fVar42 +
               (((fVar44 * DAT_0020025c + DAT_0020024c) - DAT_00200284 * DAT_00200288) -
               DAT_002000ac) * fVar40 +
               (((DAT_00200260 * fVar44 + DAT_00200250) - DAT_0020028c * DAT_00200284) -
               DAT_002000b0) * fVar41;
      fVar40 = ((fVar44 * fVar42 + (DAT_002002b4 - DAT_002000b4)) * fVar42 +
               (fVar40 * fVar44 + (DAT_002002ac - DAT_002000ac)) * fVar40 +
               (fVar41 * fVar44 + (DAT_002002b0 - DAT_002000b0)) * fVar41) /
               ((DAT_002002b4 - DAT_002000b4) * fVar42 +
               (DAT_002002ac - DAT_002000ac) * fVar40 + (DAT_002002b0 - DAT_002000b0) * fVar41);
      if (fVar40 <= 0.001) {
        fVar40 = 0.001;
      }
      (&DAT_002002e4)[uVar38] = fVar40;
    }
    else {
      fVar40 = ((pIVar19->MousePos).x - _DAT_00200304) * 0.01 + 1.0;
      if (fVar40 <= 0.001) {
        fVar40 = 0.001;
      }
      _DAT_002002ec = CONCAT44(fVar40,fVar40);
      _DAT_002002e4 = CONCAT44(fVar40,fVar40);
    }
    if (snap != (float *)0x0) {
      local_518._0_4_ = *snap;
      local_518._4_4_ = local_518._0_4_;
      aIStack_510[0].x = (float)local_518._0_4_;
      lVar34 = 0;
      do {
        ComputeSnap((float *)((long)&DAT_002002e4 + lVar34),*(float *)(local_518 + lVar34));
        lVar34 = lVar34 + 4;
      } while (lVar34 != 0xc);
    }
    lVar34 = 0;
    do {
      fVar40 = (&DAT_002002e4)[lVar34];
      if ((&DAT_002002e4)[lVar34] <= 0.001) {
        fVar40 = 0.001;
      }
      (&DAT_002002e4)[lVar34] = fVar40;
      lVar34 = lVar34 + 1;
    } while (lVar34 != 3);
    local_518._0_4_ = DAT_002002e4 * _DAT_002002f4;
    aIStack_510[1].y = DAT_002002e8 * _DAT_002002f8;
    uStack_4f0 = DAT_002002ec * _DAT_002002fc;
    _uStack_500 = ZEXT416(0);
    local_518._4_4_ = 0.0;
    aIStack_510[0].x = 0.0;
    aIStack_510[0].y = 0.0;
    aIStack_510[1].x = 0.0;
    uStack_4ec = 0.0;
    local_4e8 = 0.0;
    uStack_4e4 = 0.0;
    uStack_4e0 = 0.0;
    uStack_4dc = 1.0;
    FPU_MatrixF_x_MatrixF((float *)local_518,(float *)&DAT_0020007c,(float *)local_2c8);
    IVar6.y = fStack_2c4;
    IVar6.x = (float)local_2c8;
    IVar7.y = (float)uStack_2c0._4_4_;
    IVar7.x = (float)(undefined4)uStack_2c0;
    IVar9.y = local_2b8[5];
    IVar9.x = local_2b8[4];
    IVar11.y = local_2b8[7];
    IVar11.x = local_2b8[6];
    local_590[6].x = local_2b8[8];
    local_590[6].y = local_2b8[9];
    local_590[7].x = local_2b8[10];
    local_590[7].y = local_2b8[0xb];
    local_590[4] = IVar9;
    local_590[5] = IVar11;
    local_590[2].x = local_2b8[0];
    local_590[2].y = local_2b8[1];
    local_590[3].x = local_2b8[2];
    local_590[3].y = local_2b8[3];
    *local_590 = IVar6;
    local_590[1] = IVar7;
    if (deltaMatrix != (float *)0x0) {
      fVar40 = DAT_002002e8;
      local_518._0_4_ = DAT_002002e4;
      local_518._4_4_ = 0.0;
      aIStack_510[0].x = 0.0;
      aIStack_510[0].y = 0.0;
      aIStack_510[1].x = 0.0;
      aIStack_510[1].y = DAT_002002e8;
      _uStack_500 = ZEXT816(0);
      uStack_4f0 = DAT_002002ec;
      uStack_4ec = 0.0;
      local_4e8 = 0.0;
      uStack_4e4 = 0.0;
      uStack_4e0 = 0.0;
      uStack_4dc = 1.0;
      uVar22 = _DAT_002002e4 & 0xffffffff;
      uVar20 = _DAT_002002ec & 0xffffffff;
      deltaMatrix[8] = 0.0;
      deltaMatrix[9] = 0.0;
      *(ulong *)(deltaMatrix + 10) = uVar20;
      deltaMatrix[4] = 0.0;
      deltaMatrix[5] = fVar40;
      deltaMatrix[6] = 0.0;
      deltaMatrix[7] = 0.0;
      *(ulong *)deltaMatrix = uVar22;
      deltaMatrix[2] = 0.0;
      deltaMatrix[3] = 0.0;
      deltaMatrix[0xc] = 0.0;
      deltaMatrix[0xd] = 0.0;
      deltaMatrix[0xe] = 0.0;
      deltaMatrix[0xf] = 1.0;
    }
  }
  if (pIVar19->MouseDown[0] == false) {
    DAT_00200298 = '\0';
  }
  uVar22 = (ulong)DAT_002003ac;
LAB_00130b78:
  local_650 = uVar22;
  if ((localBounds != (float *)0x0) && (DAT_00200298 == '\0')) {
    pIVar19 = ImGui::GetIO();
    local_638 = (ulong)DAT_0020035c;
    local_630 = gContext;
    if (DAT_00200368 == '\0') {
      puVar36 = (undefined8 *)&directionUnary;
      uVar22 = 0;
      auVar13._12_4_ = 0;
      auVar13._0_12_ = local_6a8._4_12_;
      local_6a8 = auVar13 << 0x20;
      do {
        local_518._0_4_ = (undefined4)*puVar36;
        local_518._4_4_ = (undefined4)((ulong)*puVar36 >> 0x20);
        aIStack_510[0].x = (float)puVar36[1];
        aIStack_510[0].y = (float)((ulong)puVar36[1] >> 0x20);
        vec_t::TransformVector((vec_t *)local_518,(matrix_t *)&DAT_002000fc);
        fVar40 = aIStack_510[0].x;
        uVar18 = local_518._4_4_;
        uVar28 = local_518._0_4_;
        fVar41 = aIStack_510[0].x * aIStack_510[0].x +
                 (float)local_518._0_4_ * (float)local_518._0_4_ +
                 (float)local_518._4_4_ * (float)local_518._4_4_;
        if (fVar41 < 0.0) {
          fVar41 = sqrtf(fVar41);
        }
        else {
          fVar41 = SQRT(fVar41);
        }
        fVar41 = 1.0 / fVar41;
        fVar46 = (float)uVar28 * fVar41;
        fVar47 = (float)uVar18 * fVar41;
        fVar40 = fVar40 * fVar41;
        aIStack_510[0].y = fVar41 * aIStack_510[0].y;
        fVar41 = DAT_0020020c - _DAT_0020012c;
        fVar42 = DAT_00200210 - _DAT_00200130;
        fVar44 = DAT_00200214 - _DAT_00200134;
        fVar45 = fVar44 * fVar44 + fVar41 * fVar41 + fVar42 * fVar42;
        local_518._0_4_ = fVar46;
        local_518._4_4_ = fVar47;
        aIStack_510[0].x = fVar40;
        if (fVar45 < 0.0) {
          local_698._0_4_ = aIStack_510[0].y;
          local_668 = ZEXT416((uint)fVar44);
          local_678 = CONCAT44(local_678._4_4_,fVar41);
          local_5a8 = (vec_t *)CONCAT44(local_5a8._4_4_,fVar42);
          fVar45 = sqrtf(fVar45);
          fVar48 = (float)local_698._0_4_;
          fVar42 = local_5a8._0_4_;
          fVar41 = (float)local_678;
          fVar44 = (float)local_668._0_4_;
        }
        else {
          fVar45 = SQRT(fVar45);
          fVar48 = aIStack_510[0].y;
        }
        fVar45 = 1.0 / fVar45;
        fVar41 = ABS(fVar44 * fVar45 * fVar40 + fVar41 * fVar45 * fVar46 + fVar42 * fVar45 * fVar47)
        ;
        if ((float)local_6a8._0_4_ <= fVar41) {
          local_6a8._0_4_ = fVar41;
          local_638 = uVar22 & 0xffffffff;
          local_66c = fVar46;
          local_644 = fVar40;
          local_640 = fVar47;
          local_574 = fVar48;
        }
        uVar22 = uVar22 + 1;
        puVar36 = puVar36 + 2;
      } while (uVar22 != 3);
    }
    iVar26 = (int)local_638;
    local_56c = (float)(iVar26 + ((iVar26 + 1) / 3) * -3 + 1);
    local_570 = (float)(iVar26 + ((iVar26 + 2) / 3) * -3 + 2);
    local_520 = (long)(int)local_56c;
    local_528 = (long)(int)local_570;
    uVar22 = 0;
    do {
      (srcMatrix->field_0).m16[iVar26] = 0.0;
      (srcMatrix->field_0).m[0][3] = 0.0;
      uVar38 = (uint)(uVar22 >> 1) & 0x7fffffff;
      (srcMatrix->field_0).m16[local_520] = localBounds[(int)(uVar38 * 3 + (int)local_56c)];
      (srcMatrix->field_0).m16[local_528] =
           localBounds[(int)(((uint)uVar22 & 1 ^ uVar38) * 3 + (int)local_570)];
      uVar22 = uVar22 + 1;
      srcMatrix = (matrix_t *)((srcMatrix->field_0).m + 1);
    } while (uVar22 != 4);
    local_63c = -1.5673257e-38;
    if (DAT_00200299 != 0) {
      local_63c = -NAN;
    }
    FPU_MatrixF_x_MatrixF(&DAT_002000fc,(float *)&DAT_002001bc,(float *)local_628);
    local_654 = local_644 * local_644 + local_66c * local_66c + local_640 * local_640;
    local_578 = SQRT(local_654);
    lVar34 = 0;
    local_588 = pIVar19;
    do {
      local_698._0_8_ = (vec_t *)(local_2c8 + lVar34 * 0x10);
      IVar43 = worldToPos((vec_t *)(local_2c8 + lVar34 * 0x10),(matrix_t *)local_628);
      local_5e8.x = IVar43.x;
      local_5e8.y = IVar43.y;
      pvVar29 = (vec_t *)(local_2c8 + (((uint)(lVar34 + 1) & 3) << 4));
      IVar43 = worldToPos(pvVar29,(matrix_t *)local_628);
      fVar40 = local_5e8.x - IVar43.x;
      fVar41 = local_5e8.y - IVar43.y;
      fVar40 = fVar40 * fVar40 + fVar41 * fVar41;
      local_668._0_8_ = lVar34 + 1;
      local_678 = lVar34;
      local_5a8 = pvVar29;
      if (fVar40 < 0.0) {
        fVar40 = sqrtf(fVar40);
      }
      else {
        fVar40 = SQRT(fVar40);
      }
      pIVar30 = local_630;
      fVar41 = local_63c;
      iVar26 = (int)(fVar40 / 10.0);
      if (0 < iVar26) {
        fVar40 = 1.0 / (float)(int)(fVar40 / 10.0);
        local_6a8._0_4_ = fVar40 * 0.5;
        iVar33 = 0;
        do {
          fVar42 = (float)iVar33 * fVar40;
          fVar44 = IVar43.x - local_5e8.x;
          local_518._0_4_ = fVar44 * fVar42 + local_5e8.x;
          fVar45 = IVar43.y - local_5e8.y;
          local_518._4_4_ = fVar42 * fVar45 + local_5e8.y;
          local_568.x = fVar44 * (fVar42 + (float)local_6a8._0_4_) + local_5e8.x;
          local_568.y = fVar45 * (fVar42 + (float)local_6a8._0_4_) + local_5e8.y;
          ImDrawList::AddLine(pIVar30,(ImVec2 *)local_518,(ImVec2 *)&local_568,(ImU32)fVar41,3.0);
          iVar33 = iVar33 + 1;
        } while (iVar26 != iVar33);
      }
      local_518._0_4_ = (*(float *)local_698._0_8_ + local_5a8->x) * 0.5;
      local_518._4_4_ = (*(float *)(local_698._0_8_ + 4) + local_5a8->y) * 0.5;
      aIStack_510[0].x = (*(float *)(local_698._0_8_ + 8) + local_5a8->z) * 0.5;
      aIStack_510[0].y = (*(float *)(local_698._0_8_ + 0xc) + local_5a8->w) * 0.5;
      IVar43 = worldToPos((vec_t *)local_518,(matrix_t *)local_628);
      pIVar19 = local_588;
      local_568.x = IVar43.x;
      local_568.y = IVar43.y;
      fVar40 = (local_588->MousePos).x;
      fVar42 = (local_588->MousePos).y;
      fVar45 = local_5e8.x - fVar40;
      fVar44 = local_5e8.y - fVar42;
      fVar44 = fVar45 * fVar45 + fVar44 * fVar44;
      fVar40 = local_568.x - fVar40;
      fVar42 = local_568.y - fVar42;
      fVar42 = fVar40 * fVar40 + fVar42 * fVar42;
      fVar40 = fVar41;
      if (fVar44 <= 64.0) {
        fVar40 = -1.9207862e+38;
      }
      if (fVar42 <= 64.0) {
        fVar41 = -1.9207862e+38;
      }
      ImDrawList::AddCircleFilled(pIVar30,(ImVec2 *)&local_5e8,8.0,(ImU32)fVar40,0xc);
      ImDrawList::AddCircleFilled(pIVar30,(ImVec2 *)&local_568,6.0,(ImU32)fVar41,0xc);
      uVar38 = (uint)local_678;
      uVar22 = (ulong)(uVar38 ^ 2);
      if ((((DAT_00200368 == '\0') && (fVar44 <= 64.0)) && ((DAT_00200299 & 1) != 0)) &&
         (pIVar19->MouseDown[0] == true)) {
        lVar34 = uVar22 * 0x10;
        _DAT_0020031c = *(undefined8 *)(local_2c8 + lVar34);
        _DAT_00200324 = (&uStack_2c0)[uVar22 * 2];
        vec_t::TransformPoint((vec_t *)&DAT_0020031c,(matrix_t *)&DAT_002000fc);
        _DAT_0020032c = *(undefined8 *)local_698._0_8_;
        _DAT_00200334 = *(undefined8 *)(local_698._0_8_ + 8);
        vec_t::TransformPoint((vec_t *)&DAT_0020032c,(matrix_t *)&DAT_002000fc);
        fVar40 = local_578;
        if (local_654 < 0.0) {
          fVar40 = sqrtf(local_654);
        }
        fVar40 = 1.0 / fVar40;
        DAT_00200344 = local_644 * fVar40;
        _DAT_00200348 =
             fVar40 * local_574 * _DAT_00200338 +
             DAT_00200334 * DAT_00200344 +
             DAT_0020032c * local_66c * fVar40 + DAT_00200330 * local_640 * fVar40;
        _DAT_0020033c = CONCAT44(local_640 * fVar40,local_66c * fVar40);
        DAT_0020035c = (uint)local_638;
        DAT_00200360 = (int)local_520;
        DAT_00200364 = (undefined4)local_528;
        _DAT_0020034c = 0;
        _DAT_00200354 = 0;
        (&DAT_0020034c)[local_520] = *(undefined4 *)(local_2c8 + local_520 * 4 + lVar34);
        (&DAT_0020034c)[local_528] = *(undefined4 *)(local_2c8 + local_528 * 4 + lVar34);
        DAT_00200368 = '\x01';
        _DAT_0020036c = _DAT_002000fc;
        _DAT_00200374 = _DAT_00200104;
        _DAT_0020037c = _DAT_0020010c;
        _DAT_00200384 = _DAT_00200114;
        _DAT_0020038c = _DAT_0020011c;
        _DAT_00200394 = _DAT_00200124;
        _DAT_0020039c = _DAT_0020012c;
        IRam00000000002003a4 = _DAT_00200134;
      }
      if (((DAT_00200368 == '\0') && (fVar42 <= 64.0)) &&
         (((DAT_00200299 & 1) != 0 && (pIVar19->MouseDown[0] == true)))) {
        uVar20 = (ulong)((uVar38 - 1 & 3) << 4);
        _DAT_0020031c =
             CONCAT44(((&fStack_2c4)[uVar22 * 4] + *(float *)((long)&fStack_2c4 + uVar20)) * 0.5,
                      (*(float *)(local_2c8 + uVar22 * 0x10) + *(float *)(local_2c8 + uVar20)) * 0.5
                     );
        _DAT_00200324 =
             CONCAT44((local_2b8[uVar22 * 4 + -1] + *(float *)((long)local_2b8 + (uVar20 - 4))) *
                      0.5,(*(float *)(&uStack_2c0 + uVar22 * 2) +
                          *(float *)((long)&uStack_2c0 + uVar20)) * 0.5);
        vec_t::TransformPoint((vec_t *)&DAT_0020031c,(matrix_t *)&DAT_002000fc);
        _DAT_0020032c = CONCAT44(local_518._4_4_,local_518._0_4_);
        _DAT_00200334 = CONCAT44(aIStack_510[0].y,aIStack_510[0].x);
        vec_t::TransformPoint((vec_t *)&DAT_0020032c,(matrix_t *)&DAT_002000fc);
        fVar40 = local_578;
        if (local_654 < 0.0) {
          fVar40 = sqrtf(local_654);
        }
        fVar40 = 1.0 / fVar40;
        DAT_00200344 = local_644 * fVar40;
        _DAT_00200348 =
             fVar40 * local_574 * _DAT_00200338 +
             DAT_00200334 * DAT_00200344 +
             DAT_0020032c * local_66c * fVar40 + DAT_00200330 * local_640 * fVar40;
        _DAT_0020033c = CONCAT44(local_640 * fVar40,local_66c * fVar40);
        DAT_0020035c = (uint)local_638;
        local_308._0_4_ = local_56c;
        local_308._4_4_ = local_570;
        DAT_00200360 = *(int *)(local_308 + (ulong)(uVar38 & 1) * 4);
        DAT_00200364 = 0xffffffff;
        _DAT_0020034c = 0;
        _DAT_00200354 = 0;
        (&DAT_0020034c)[DAT_00200360] =
             *(undefined4 *)(local_2c8 + (long)DAT_00200360 * 4 + uVar22 * 0x10);
        DAT_00200368 = '\x01';
        _DAT_0020036c = _DAT_002000fc;
        _DAT_00200374 = _DAT_00200104;
        _DAT_0020037c = _DAT_0020010c;
        _DAT_00200384 = _DAT_00200114;
        _DAT_0020038c = _DAT_0020011c;
        _DAT_00200394 = _DAT_00200124;
        _DAT_0020039c = _DAT_0020012c;
        IRam00000000002003a4 = _DAT_00200134;
      }
      lVar34 = local_668._0_8_;
    } while (local_668._0_8_ != 4);
    if (DAT_00200368 != '\0') {
      local_5e8.x = 1.0;
      local_5e8.y = 0.0;
      local_5e8.z = 0.0;
      local_5e8.w = 0.0;
      afStack_5d8[0] = 0.0;
      afStack_5d8[1] = 1.0;
      afStack_5d8[2] = 0.0;
      afStack_5d8[3] = 0.0;
      IStack_5c8.x = 0.0;
      IStack_5c8.y = 0.0;
      local_5c0 = 1.0;
      local_5bc = 0.0;
      fStack_5b8 = 0.0;
      uStack_5b4 = 0;
      fVar40 = DAT_00200344 * DAT_00200264 +
               DAT_0020033c * DAT_0020025c + DAT_00200340 * DAT_00200260;
      uVar38 = -(uint)(ABS(fVar40) < 1.1920929e-07);
      local_5ac = 1.0;
      fVar40 = (float)(uVar38 & 0xbf800000 |
                      ~uVar38 & (uint)(-((DAT_00200344 * DAT_00200254 +
                                         DAT_0020033c * DAT_0020024c + DAT_00200340 * DAT_00200250)
                                        - _DAT_00200348) / fVar40));
      local_678 = CONCAT44(local_678._4_4_,(DAT_00200260 * fVar40 + DAT_00200250) - DAT_00200320);
      local_668 = ZEXT416((uint)ABS((DAT_0020025c * fVar40 + DAT_0020024c) - DAT_0020031c));
      local_5a8 = (vec_t *)(ulong)(uint)ABS((fVar40 * DAT_00200264 + DAT_00200254) - DAT_00200324);
      uStack_5a0 = 0;
      uStack_59c = 0;
      fVar40 = DAT_0020032c - DAT_0020031c;
      local_6a8._0_4_ = DAT_00200330 - DAT_00200320;
      local_698 = ZEXT416((uint)ABS(DAT_00200334 - DAT_00200324));
      lVar34 = 0;
      do {
        lVar21 = (long)(&DAT_00200360)[lVar34];
        if (lVar21 != -1) {
          fVar42 = ABS((&DAT_00200374)[lVar21 * 4]) * (float)local_698._0_4_ +
                   ABS((&DAT_0020036c)[lVar21 * 4]) * ABS(fVar40) +
                   ABS((float)local_6a8._0_4_ * (&DAT_00200370)[lVar21 * 4]);
          fVar41 = 1.0;
          if (1.1920929e-07 < fVar42) {
            fVar41 = (ABS((&DAT_00200374)[lVar21 * 4]) * local_5a8._0_4_ +
                      ABS((&DAT_0020036c)[lVar21 * 4]) * (float)local_668._0_4_ +
                      ABS((&DAT_00200370)[lVar21 * 4] * (float)local_678) + 0.0) / fVar42;
          }
          if (boundsSnap != (float *)0x0) {
            fVar42 = localBounds[lVar21 + 3] - localBounds[lVar21];
            local_518._0_4_ = fVar42 * fVar41;
            ComputeSnap((float *)local_518,boundsSnap[lVar21]);
            fVar41 = (float)(~-(uint)(1.1920929e-07 < fVar42) & (uint)fVar41 |
                            (uint)((float)local_518._0_4_ / fVar42) &
                            -(uint)(1.1920929e-07 < fVar42));
          }
          (&local_5e8)[lVar21].x = (&local_5e8)[lVar21].x * fVar41;
          (&local_5e8)[lVar21].y = (&local_5e8)[lVar21].y * fVar41;
          (&local_5e8)[lVar21].z = (&local_5e8)[lVar21].z * fVar41;
          (&local_5e8)[lVar21].w = fVar41 * (&local_5e8)[lVar21].w;
        }
        lVar34 = lVar34 + 1;
      } while (lVar34 == 1);
      local_308._0_4_ = 1.0;
      local_308._4_4_ = 0.0;
      local_308._8_4_ = 0.0;
      local_308._12_8_ = 0;
      local_2f4 = 0x3f800000;
      local_2f0 = 0;
      uStack_2e8 = 0;
      local_2e0 = 0x3f800000;
      local_2d8 = DAT_0020034c;
      local_538 = DAT_0020034c ^ 0x80000000;
      local_2d4 = DAT_00200350;
      local_534 = DAT_00200350 ^ 0x80000000;
      local_530 = DAT_00200354 ^ 0x80000000;
      local_568.x = 1.0;
      local_568.y = 0.0;
      local_568.z = 0.0;
      local_568.w = 0.0;
      uStack_558 = 0;
      local_554 = 0x3f800000;
      local_550 = 0;
      uStack_548 = 0;
      local_540 = 0x3f800000;
      local_52c = 0x3f800000;
      local_2d0 = DAT_00200354;
      local_2cc = 0x3f800000;
      FPU_MatrixF_x_MatrixF(&local_568.x,&local_5e8.x,&local_c8[0].x);
      FPU_MatrixF_x_MatrixF(&local_c8[0].x,(float *)local_308,(float *)local_518);
      FPU_MatrixF_x_MatrixF((float *)local_518,&DAT_0020036c,&local_88.x);
      local_590[6] = local_58;
      local_590[7] = IStack_50;
      local_590[4] = local_68;
      local_590[5] = IStack_60;
      local_590[2] = local_78;
      local_590[3] = IStack_70;
      *local_590 = local_88;
      local_590[1] = IStack_80;
      IVar43 = worldToPos((vec_t *)&DAT_002000ac,(matrix_t *)&DAT_002001bc);
      fVar40 = DAT_00200374 * DAT_00200374 +
               DAT_0020036c * DAT_0020036c + DAT_00200370 * DAT_00200370;
      if (fVar40 < 0.0) {
        fVar40 = sqrtf(fVar40);
      }
      else {
        fVar40 = SQRT(fVar40);
      }
      local_698._0_4_ = fVar40;
      fVar40 = local_5e8.z * local_5e8.z + local_5e8.x * local_5e8.x + local_5e8.y * local_5e8.y;
      if (fVar40 < 0.0) {
        fVar40 = sqrtf(fVar40);
      }
      else {
        fVar40 = SQRT(fVar40);
      }
      local_6a8._0_4_ = fVar40;
      fVar40 = DAT_00200384 * DAT_00200384 +
               DAT_0020037c * DAT_0020037c + DAT_00200380 * DAT_00200380;
      if (fVar40 < 0.0) {
        sqrtf(fVar40);
      }
      fVar40 = afStack_5d8[2] * afStack_5d8[2] +
               afStack_5d8[0] * afStack_5d8[0] + afStack_5d8[1] * afStack_5d8[1];
      if (fVar40 < 0.0) {
        sqrtf(fVar40);
      }
      fVar40 = DAT_00200394 * DAT_00200394 +
               DAT_0020038c * DAT_0020038c + DAT_00200390 * DAT_00200390;
      if (fVar40 < 0.0) {
        local_6a8._0_4_ = localBounds[5] - localBounds[2];
        fVar40 = sqrtf(fVar40);
        fVar41 = (float)local_6a8._0_4_;
      }
      else {
        fVar40 = SQRT(fVar40);
        fVar41 = localBounds[5] - localBounds[2];
      }
      fVar42 = local_5c0 * local_5c0 + IStack_5c8.x * IStack_5c8.x + IStack_5c8.y * IStack_5c8.y;
      if (fVar42 < 0.0) {
        local_6a8._0_4_ = fVar41 * fVar40;
        sqrtf(fVar42);
      }
      ImFormatString(local_518,0x200,"X: %.2f Y: %.2f Z:%.2f");
      pIVar30 = local_630;
      local_6e8 = IVar43.x;
      fStack_6e4 = IVar43.y;
      local_c8[0].y = fStack_6e4 + 15.0;
      local_c8[0].x = local_6e8 + 15.0;
      ImDrawList::AddText(local_630,local_c8,0xff000000,local_518,(char *)0x0);
      local_c8[0].y = fStack_6e4 + 14.0;
      local_c8[0].x = local_6e8 + 14.0;
      ImDrawList::AddText(pIVar30,local_c8,0xffffffff,local_518,(char *)0x0);
    }
    if (pIVar19->MouseDown[0] == false) {
      DAT_00200368 = '\0';
    }
  }
  pIVar30 = gContext;
  if (DAT_00200368 != '\0') {
    return;
  }
  if (local_57c == TRANSLATE) {
    if (gContext == (ImDrawList *)0x0) {
      return;
    }
    if (DAT_00200299 == 0) {
      local_2b8[0] = -1.5881867e-23;
      local_2b8[1] = -1.5881867e-23;
      local_2b8[2] = -1.5881867e-23;
      local_2c8 = (undefined1  [4])0x99999999;
      fStack_2c4 = -1.5881867e-23;
      uStack_2c0._0_4_ = -1.5881867e-23;
      uStack_2c0._4_4_ = -1.5881867e-23;
    }
    else {
      local_2c8 = (undefined1  [4])(-(uint)((int)local_650 != 7) | 0xff1080ff);
      uVar22 = 2;
      lVar34 = 0;
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar22;
        uVar18 = 0xff1080ff;
        uVar28 = 0xff1080ff;
        if ((local_650 & 0xffffffff) * 4 + -4 != lVar34) {
          uVar28 = *(undefined4 *)((long)&directionColor + lVar34);
        }
        *(undefined4 *)((long)&fStack_2c4 + lVar34) = uVar28;
        if ((local_650 & 0xffffffff) * 4 + -0x10 != lVar34) {
          uVar18 = *(undefined4 *)
                    (&UNK_001a98d8 +
                    lVar34 + (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                             0xfffffffffffffffcU) * -3);
        }
        *(undefined4 *)((long)local_2b8 + lVar34) = uVar18;
        lVar34 = lVar34 + 4;
        uVar22 = uVar22 + 1;
      } while (lVar34 != 0xc);
    }
    ImDrawList::AddRectFilled
              (gContext,(ImVec2 *)&DAT_00200274,(ImVec2 *)&DAT_0020027c,(ImU32)local_2c8,2.0,-1);
    lVar34 = 0;
    do {
      ComputeTripodAxisAndVisibility
                ((int)lVar34,(vec_t *)local_628,&local_5e8,(bool *)&local_88,(bool *)local_c8);
      fVar41 = afStack_624[2];
      fVar40 = afStack_624[1];
      if (local_88.x._0_1_ == '\x01') {
        local_6a8 = ZEXT416((uint)local_628);
        fVar42 = afStack_624[0];
        local_518._0_4_ = (float)local_628 * 0.1 * DAT_00200284;
        local_518._4_4_ = afStack_624[0] * 0.1 * DAT_00200284;
        aIStack_510[0].x = afStack_624[1] * 0.1 * DAT_00200284;
        aIStack_510[0].y = afStack_624[2] * 0.1 * DAT_00200284;
        IVar43 = worldToPos((vec_t *)local_518,(matrix_t *)&DAT_0020017c);
        local_568.x = IVar43.x;
        local_568.y = IVar43.y;
        local_518._0_4_ = (float)local_6a8._0_4_ * DAT_00200284;
        local_518._4_4_ = fVar42 * DAT_00200284;
        aIStack_510[0].x = fVar40 * DAT_00200284;
        aIStack_510[0].y = fVar41 * DAT_00200284;
        IVar43 = worldToPos((vec_t *)local_518,(matrix_t *)&DAT_0020017c);
        local_308._0_4_ = IVar43.x;
        local_308._4_4_ = IVar43.y;
        ImDrawList::AddLine(pIVar30,(ImVec2 *)&local_568,(ImVec2 *)local_308,
                            (ImU32)(&fStack_2c4)[lVar34],6.0);
        if ((float)(&DAT_00200310)[lVar34] <= 0.0 && (float)(&DAT_00200310)[lVar34] != 0.0) {
          DrawHatchedAxis((vec_t *)local_628);
        }
      }
      fVar40 = afStack_624[1];
      if (local_c8[0].x._0_1_ == '\x01') {
        aIStack_510[1].x = 0.0;
        aIStack_510[1].y = 0.0;
        auVar14._8_8_ = 0;
        auVar14._0_4_ = local_4f8.x;
        auVar14._4_4_ = local_4f8.y;
        _uStack_500 = auVar14 << 0x40;
        local_518._0_4_ = 0.0;
        local_518._4_4_ = 0.0;
        aIStack_510[0].x = 0.0;
        aIStack_510[0].y = 0.0;
        auVar16 = local_628;
        fVar41 = afStack_624[0];
        local_6a8._0_4_ = afStack_624[2];
        local_698._0_4_ = local_5e8.x;
        local_668._0_4_ = local_5e8.y;
        local_678 = CONCAT44(local_678._4_4_,local_5e8.z);
        local_5a8 = (vec_t *)CONCAT44(local_5a8._4_4_,local_5e8.w);
        lVar21 = 0;
        do {
          fVar42 = (float)(&quadUV)[lVar21 * 2];
          fVar44 = (float)(&DAT_001a9984)[lVar21 * 2];
          local_568.x = ((float)local_698._0_4_ * fVar44 + (float)auVar16 * fVar42) * DAT_00200284;
          local_568.y = ((float)local_668._0_4_ * fVar44 + fVar41 * fVar42) * DAT_00200284;
          local_568.z = ((float)local_678 * fVar44 + fVar40 * fVar42) * DAT_00200284;
          local_568.w = (fVar44 * local_5a8._0_4_ + fVar42 * (float)local_6a8._0_4_) * DAT_00200284;
          IVar43 = worldToPos(&local_568,(matrix_t *)&DAT_0020017c);
          *(ImVec2 *)(local_518 + lVar21 * 8) = IVar43;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 4);
        ImDrawList::AddConvexPolyFilled(pIVar30,(ImVec2 *)local_518,4,(ImU32)local_2b8[lVar34],true)
        ;
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != 3);
    if (DAT_00200298 == '\0') {
      return;
    }
    IVar43 = worldToPos((vec_t *)&DAT_002002bc,(matrix_t *)&DAT_002001bc);
    local_5e8.x = IVar43.x;
    local_5e8.y = IVar43.y;
    IVar43 = worldToPos((vec_t *)&DAT_002000ac,(matrix_t *)&DAT_002001bc);
    local_568.x = IVar43.x;
    local_568.y = IVar43.y;
    fVar42 = local_568.x - local_5e8.x;
    fVar41 = local_568.y - local_5e8.y;
    fVar40 = fVar42 * fVar42 + fVar41 * fVar41;
    if (fVar40 < 0.0) {
      fVar40 = sqrtf(fVar40);
    }
    else {
      fVar40 = SQRT(fVar40);
    }
    fVar42 = fVar42 * (1.0 / fVar40) * 5.0;
    fVar40 = fVar41 * (1.0 / fVar40) * 5.0;
    ImDrawList::AddCircle(pIVar30,(ImVec2 *)&local_5e8,6.0,0xaaaaaaaa,0xc,1.0);
    ImDrawList::AddCircle(pIVar30,(ImVec2 *)&local_568,6.0,0xaaaaaaaa,0xc,1.0);
    local_518._0_4_ = local_5e8.x + fVar42;
    local_518._4_4_ = local_5e8.y + fVar40;
    afStack_624[0] = local_568.y - fVar40;
    local_628 = (undefined1  [4])(local_568.x - fVar42);
    ImDrawList::AddLine(pIVar30,(ImVec2 *)local_518,(ImVec2 *)local_628,0xaaaaaaaa,2.0);
    _local_628 = CONCAT44(DAT_002000b0 - DAT_002002c0,DAT_002000ac - DAT_002002bc);
    afStack_624[1] = DAT_002000b4 - DAT_002002c4;
    afStack_624[2] = DAT_002000b8 - DAT_002002c8;
    lVar34 = (long)((int)local_650 * 3 + -3);
    buf = local_518;
    ImFormatString(buf,0x200,
                   _ZN8ImGuizmoL19translationInfoMaskE_rel +
                   *(int *)(&DAT_001a98e8 + (long)(int)local_650 * 4),
                   (double)*(float *)(local_628 +
                                     (long)*(int *)(translationInfoIndex + lVar34 * 4) * 4),
                   (double)*(float *)(local_628 +
                                     (long)*(int *)(translationInfoIndex + lVar34 * 4 + 4) * 4),
                   SUB84((double)*(float *)(local_628 +
                                           (long)*(int *)(translationInfoIndex + lVar34 * 4 + 8) * 4
                                           ),0));
    local_308._0_4_ = local_568.x + 15.0;
    local_308._4_4_ = local_568.y + 15.0;
    ImDrawList::AddText(pIVar30,(ImVec2 *)local_308,0xff000000,buf,(char *)0x0);
    local_308._0_4_ = local_568.x + 14.0;
    local_308._4_4_ = local_568.y + 14.0;
    pvVar29 = (vec_t *)local_308;
  }
  else if (local_57c == SCALE) {
    local_698._0_8_ = gContext;
    if (DAT_00200299 == 0) {
      local_2b8[0] = -1.5881867e-23;
      local_2b8[1] = -1.5881867e-23;
      local_2b8[2] = -1.5881867e-23;
      local_2c8 = (undefined1  [4])0x99999999;
      fStack_2c4 = -1.5881867e-23;
      uStack_2c0._0_4_ = -1.5881867e-23;
      uStack_2c0._4_4_ = -1.5881867e-23;
    }
    else {
      local_2c8 = (undefined1  [4])(-(uint)((int)local_650 != 0xf) | 0xff1080ff);
      lVar34 = 0;
      do {
        uVar28 = 0xff1080ff;
        if ((local_650 & 0xffffffff) * 4 + -0x30 != lVar34) {
          uVar28 = *(undefined4 *)((long)&directionColor + lVar34);
        }
        *(undefined4 *)((long)&fStack_2c4 + lVar34) = uVar28;
        lVar34 = lVar34 + 4;
      } while (lVar34 != 0xc);
    }
    ImDrawList::AddCircleFilled(gContext,(ImVec2 *)&DAT_0020026c,12.0,(ImU32)local_2c8,0x20);
    _local_628 = 0x3f8000003f800000;
    afStack_624[1] = 1.0;
    afStack_624[2] = 1.0;
    if (DAT_00200298 == '\x01') {
      _local_628 = _DAT_002002e4;
      afStack_624[1] = (float)_DAT_002002ec;
      afStack_624[2] = (float)(_DAT_002002ec >> 0x20);
    }
    lVar34 = 0;
    do {
      ComputeTripodAxisAndVisibility
                ((int)lVar34,(vec_t *)local_518,&local_5e8,&local_6a9,&local_679);
      fVar40 = aIStack_510[0].x;
      uVar18 = local_518._4_4_;
      uVar28 = local_518._0_4_;
      if (local_6a9 == true) {
        local_6a8 = ZEXT416((uint)aIStack_510[0].y);
        local_568.x = (float)local_518._0_4_ * 0.1 * DAT_00200284;
        local_568.y = (float)local_518._4_4_ * 0.1 * DAT_00200284;
        local_568.z = aIStack_510[0].x * 0.1 * DAT_00200284;
        local_568.w = aIStack_510[0].y * 0.1 * DAT_00200284;
        IVar43 = worldToPos(&local_568,(matrix_t *)&DAT_0020017c);
        local_308._0_4_ = IVar43.x;
        local_308._4_4_ = IVar43.y;
        local_568.x = (float)uVar28 * DAT_00200284;
        local_568.y = (float)uVar18 * DAT_00200284;
        local_568.z = fVar40 * DAT_00200284;
        local_568.w = DAT_00200284 * (float)local_6a8._0_4_;
        local_88 = worldToPos(&local_568,(matrix_t *)&DAT_0020017c);
        fVar41 = *(float *)(local_628 + lVar34 * 4);
        fVar42 = (float)uVar28 * fVar41;
        fVar44 = (float)uVar18 * fVar41;
        fVar40 = fVar40 * fVar41;
        local_6a8._0_4_ = (float)local_6a8._0_4_ * fVar41;
        local_568.x = fVar42 * DAT_00200284;
        local_568.y = fVar44 * DAT_00200284;
        local_568.z = fVar40 * DAT_00200284;
        local_568.w = DAT_00200284 * (float)local_6a8._0_4_;
        local_c8[0] = worldToPos(&local_568,(matrix_t *)&DAT_0020017c);
        if (DAT_00200298 == '\x01') {
          uVar15 = local_698._0_8_;
          ImDrawList::AddLine((ImDrawList *)local_698._0_8_,(ImVec2 *)local_308,&local_88,0xff404040
                              ,6.0);
          ImDrawList::AddCircleFilled((ImDrawList *)uVar15,&local_88,10.0,0xff404040,0xc);
        }
        fVar41 = (&fStack_2c4)[lVar34];
        uVar15 = local_698._0_8_;
        ImDrawList::AddLine((ImDrawList *)local_698._0_8_,(ImVec2 *)local_308,local_c8,(ImU32)fVar41
                            ,6.0);
        ImDrawList::AddCircleFilled((ImDrawList *)uVar15,local_c8,10.0,(ImU32)fVar41,0xc);
        if ((float)(&DAT_00200310)[lVar34] <= 0.0 && (float)(&DAT_00200310)[lVar34] != 0.0) {
          local_568.w = (float)local_6a8._0_4_;
          local_568.x = fVar42;
          local_568.y = fVar44;
          local_568.z = fVar40;
          DrawHatchedAxis(&local_568);
        }
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != 3);
    if (DAT_00200298 == '\0') {
      return;
    }
    IVar43 = worldToPos((vec_t *)&DAT_002000ac,(matrix_t *)&DAT_002001bc);
    buf = local_518;
    ImFormatString(buf,0x200,
                   _ZN8ImGuizmoL13scaleInfoMaskE_rel +
                   *(int *)(translationInfoIndex + (long)(int)local_650 * 4 + 0x24),
                   (double)*(float *)(local_628 +
                                     (long)*(int *)(translationInfoIndex +
                                                   (long)((int)local_650 * 3 + -0x24) * 4) * 4));
    local_6d8 = IVar43.x;
    fStack_6d4 = IVar43.y;
    local_5e8.x = local_6d8 + 15.0;
    local_5e8.y = fStack_6d4 + 15.0;
    pIVar30 = (ImDrawList *)local_698._0_8_;
    ImDrawList::AddText((ImDrawList *)local_698._0_8_,(ImVec2 *)&local_5e8,0xff000000,buf,
                        (char *)0x0);
    local_5e8.x = local_6d8 + 14.0;
    local_5e8.y = fStack_6d4 + 14.0;
    pvVar29 = &local_5e8;
  }
  else {
    if (local_57c != ROTATE) {
      return;
    }
    local_668._0_8_ = gContext;
    ImGui::GetIO();
    if (DAT_00200299 == 0) {
      afStack_624[3] = -1.5881867e-23;
      afStack_624[4] = -1.5881867e-23;
      afStack_624[5] = -1.5881867e-23;
      _local_628 = 0x9999999999999999;
      afStack_624[1] = -1.5881867e-23;
      afStack_624[2] = -1.5881867e-23;
    }
    else {
      _local_628 = CONCAT44(afStack_624[0],-(uint)((int)local_650 != 0xb)) | 0xff1080ff;
      lVar34 = 0;
      do {
        uVar28 = 0xff1080ff;
        if ((local_650 & 0xffffffff) * 4 + -0x20 != lVar34) {
          uVar28 = *(undefined4 *)((long)&directionColor + lVar34);
        }
        *(undefined4 *)(local_628 + lVar34 + 4) = uVar28;
        lVar34 = lVar34 + 4;
      } while (lVar34 != 0xc);
    }
    fVar41 = DAT_002000ac - DAT_0020020c;
    fVar44 = DAT_002000b0 - DAT_00200210;
    fVar42 = DAT_002000b4 - DAT_00200214;
    fVar40 = fVar42 * fVar42 + fVar41 * fVar41 + fVar44 * fVar44;
    if (fVar40 < 0.0) {
      local_6a8 = ZEXT416((uint)(DAT_002000b8 - _DAT_00200218));
      fVar40 = sqrtf(fVar40);
      local_5e8.w = (float)local_6a8._0_4_;
    }
    else {
      fVar40 = SQRT(fVar40);
      local_5e8.w = DAT_002000b8 - _DAT_00200218;
    }
    fVar40 = 1.0 / fVar40;
    local_5e8.x = fVar41 * fVar40;
    local_5e8.y = fVar44 * fVar40;
    local_5e8.z = fVar42 * fVar40;
    local_5e8.w = local_5e8.w * fVar40;
    vec_t::TransformVector(&local_5e8,(matrix_t *)&DAT_002000bc);
    lVar34 = 0;
    do {
      memset(local_518,0,0x200);
      iVar26 = (int)lVar34;
      local_6a8._0_8_ = 3U - lVar34;
      uVar22 = 3U - lVar34 & 0xffffffff;
      if (lVar34 == 0) {
        uVar22 = 0;
      }
      fVar40 = atan2f((&local_5e8.x)[(4U - iVar26) % 3],(&local_5e8.x)[uVar22]);
      lVar21 = lVar34 + 1;
      local_698._0_8_ = lVar21;
      if (lVar21 == 3) {
        lVar21 = 0;
      }
      lVar27 = 0;
      do {
        fVar41 = (float)(int)lVar27 * 0.015625 * 3.1415927 + fVar40 + 1.5707964;
        fVar42 = cosf(fVar41);
        fStack_2c4 = sinf(fVar41);
        local_2c8 = (undefined1  [4])fVar42;
        uStack_2c0._0_4_ = 0.0;
        uStack_2c0._4_4_ = 0.0;
        local_568.x = *(float *)(local_2c8 + lVar34 * 4) * DAT_00200284;
        local_568.y = *(float *)(local_2c8 + lVar21 * 4) * DAT_00200284;
        local_568.z = *(float *)(local_2c8 + (ulong)(iVar26 + ((iVar26 + 2U) / 3) * -3 + 2) * 4) *
                      DAT_00200284;
        local_568.w = DAT_00200284 * 0.0;
        IVar43 = worldToPos(&local_568,(matrix_t *)&DAT_0020017c);
        *(ImVec2 *)(local_518 + lVar27 * 8) = IVar43;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x40);
      ImDrawList::AddPolyline
                ((ImDrawList *)local_668._0_8_,(ImVec2 *)local_518,0x40,
                 *(ImU32 *)(local_628 + local_6a8._0_8_ * 4),false,2.0,true);
      lVar34 = local_698._0_8_;
    } while (local_698._0_8_ != 3);
    IVar43 = worldToPos((vec_t *)&DAT_002000ac,(matrix_t *)&DAT_002001bc);
    local_518._0_4_ = IVar43.x;
    local_518._4_4_ = IVar43.y;
    ImDrawList::AddCircle
              ((ImDrawList *)local_668._0_8_,(ImVec2 *)local_518,DAT_002003bc * 0.06,
               (ImU32)local_628,0x40,1.0);
    if (DAT_00200298 == '\0') {
      return;
    }
    uVar22 = 0;
    memset(local_518,0,0x208);
    IVar43 = worldToPos((vec_t *)&DAT_002000ac,(matrix_t *)&DAT_002001bc);
    local_518._0_4_ = IVar43.x;
    local_518._4_4_ = IVar43.y;
    do {
      matrix_t::RotationAxis
                ((matrix_t *)local_2c8,(vec_t *)&DAT_0020029c,
                 ((float)(uVar22 & 0xffffffff) / 63.0) * DAT_002002dc);
      local_568.x = (local_2b8[4] * DAT_002002d4 +
                     (float)local_2c8 * DAT_002002cc + local_2b8[0] * DAT_002002d0 + local_2b8[8]) *
                    DAT_00200284 + DAT_002000ac;
      local_568.y = (local_2b8[5] * DAT_002002d4 +
                     fStack_2c4 * DAT_002002cc + local_2b8[1] * DAT_002002d0 + local_2b8[9]) *
                    DAT_00200284 + DAT_002000b0;
      local_568.z = (local_2b8[6] * DAT_002002d4 +
                     (float)(undefined4)uStack_2c0 * DAT_002002cc + local_2b8[2] * DAT_002002d0 +
                    local_2b8[10]) * DAT_00200284 + DAT_002000b4;
      local_568.w = (DAT_002002d4 * local_2b8[7] +
                     DAT_002002cc * (float)uStack_2c0._4_4_ + DAT_002002d0 * local_2b8[3] +
                    local_2b8[0xb]) * DAT_00200284 + DAT_002000b8;
      IVar43 = worldToPos(&local_568,(matrix_t *)&DAT_002001bc);
      aIStack_510[uVar22] = IVar43;
      uVar22 = uVar22 + 1;
    } while (uVar22 != 0x3f);
    pIVar30 = (ImDrawList *)local_668._0_8_;
    ImDrawList::AddConvexPolyFilled
              ((ImDrawList *)local_668._0_8_,(ImVec2 *)local_518,0x40,0x801080ff,true);
    ImDrawList::AddPolyline(pIVar30,(ImVec2 *)local_518,0x40,0xff1080ff,true,2.0,true);
    fVar41 = aIStack_510[0].y;
    fVar40 = aIStack_510[0].x;
    buf = local_2c8;
    ImFormatString(buf,0x200,
                   (char *)((long)&_ZN8ImGuizmoL16rotationInfoMaskE_rel +
                           (long)*(int *)("Y : %5.2f" + (long)(int)local_650 * 4 + 8)),
                   (double)((DAT_002002dc / 3.1415927) * 180.0),(double)DAT_002002dc);
    local_568.x = fVar40 + 15.0;
    local_568.y = fVar41 + 15.0;
    ImDrawList::AddText(pIVar30,(ImVec2 *)&local_568,0xff000000,buf,(char *)0x0);
    local_568.x = fVar40 + 14.0;
    local_568.y = fVar41 + 14.0;
    pvVar29 = &local_568;
  }
  ImDrawList::AddText(pIVar30,(ImVec2 *)pvVar29,0xffffffff,buf,(char *)0x0);
  return;
}

Assistant:

void Manipulate(const float *view, const float *projection, OPERATION operation, MODE mode, float *matrix, float *deltaMatrix, float *snap, float *localBounds, float *boundsSnap)
   {
      ComputeContext(view, projection, matrix, mode);

      // set delta to identity 
      if (deltaMatrix)
         ((matrix_t*)deltaMatrix)->SetToIdentity();

      // behind camera
      vec_t camSpacePosition;
      camSpacePosition.TransformPoint(makeVect(0.f, 0.f, 0.f), gContext.mMVP);
      if (camSpacePosition.z < 0.001f)
         return;

      // -- 
      int type = NONE;
      if (gContext.mbEnable)
      {
		  if (!gContext.mbUsingBounds)
		  {
			  switch (operation)
			  {
			  case ROTATE:
				  HandleRotation(matrix, deltaMatrix, type, snap);
				  break;
			  case TRANSLATE:
				  HandleTranslation(matrix, deltaMatrix, type, snap);
				  break;
			  case SCALE:
				  HandleScale(matrix, deltaMatrix, type, snap);
				  break;
			  }
		  }
      }

	  if (localBounds && !gContext.mbUsing)
		  HandleAndDrawLocalBounds(localBounds, (matrix_t*)matrix, boundsSnap);

	  if (!gContext.mbUsingBounds)
	  {
		  switch (operation)
		  {
		  case ROTATE:
			  DrawRotationGizmo(type);
			  break;
		  case TRANSLATE:
			  DrawTranslationGizmo(type);
			  break;
		  case SCALE:
			  DrawScaleGizmo(type);
			  break;
		  }
	  }
   }